

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

bool __thiscall
google::
dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
::resize_delta(dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               *this,size_type delta)

{
  ulong uVar1;
  bool bVar2;
  unsigned_long uVar3;
  length_error *this_00;
  size_type sVar4;
  size_type sVar5;
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *this_01;
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *pdVar6;
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *pdVar7;
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *pdVar8;
  long in_RSI;
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *in_RDI;
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  tmp;
  size_type target;
  size_type resize_to;
  size_type needed_size;
  bool did_resize;
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_ffffffffffffff00;
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_ffffffffffffff38;
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_ffffffffffffff40;
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_ffffffffffffffd0;
  bool local_19;
  bool local_1;
  
  local_19 = false;
  bVar2 = sparsehash_internal::sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>::
          consider_shrink((sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4> *)in_RDI);
  if (bVar2) {
    local_19 = maybe_shrink(in_stack_ffffffffffffffd0);
  }
  uVar1 = in_RDI->num_elements;
  uVar3 = std::numeric_limits<unsigned_long>::max();
  if (uVar1 < uVar3 - in_RSI) {
    sVar4 = bucket_count(in_RDI);
    if ((sVar4 < 4) ||
       (sVar4 = in_RDI->num_elements,
       sVar5 = sparsehash_internal::sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>::
               enlarge_threshold((sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4> *)
                                 in_RDI), sVar5 < sVar4 + in_RSI)) {
      this_01 = (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                 *)sparsehash_internal::
                   sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>::min_buckets
                             ((sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4> *)
                              in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38,
                              (size_type)in_RDI);
      pdVar6 = (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                *)bucket_count(in_RDI);
      if (pdVar6 < this_01) {
        pdVar6 = (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)((in_RDI->num_elements - in_RDI->num_deleted) + in_RSI);
        bucket_count(in_RDI);
        pdVar7 = (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)sparsehash_internal::
                    sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>::min_buckets
                              ((sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4> *)
                               in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38,
                               (size_type)in_RDI);
        pdVar8 = (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)sparsehash_internal::
                    sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>::min_buckets
                              ((sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4> *)
                               in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38,
                               (size_type)in_RDI);
        if ((pdVar7 < pdVar8) &&
           (in_stack_ffffffffffffff00 = pdVar7, uVar3 = std::numeric_limits<unsigned_long>::max(),
           in_stack_ffffffffffffff00 <
           (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
            *)(uVar3 >> 1))) {
          sparsehash_internal::sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>::
          shrink_size((sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4> *)in_RDI,
                      (long)pdVar7 << 1);
        }
        dense_hashtable(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,(size_type)in_RDI);
        swap(this_01,pdVar6);
        local_1 = true;
        ~dense_hashtable(in_stack_ffffffffffffff00);
      }
      else {
        local_1 = local_19;
      }
    }
    else {
      local_1 = local_19;
    }
    return local_1;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this_00,"resize overflow");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

bool resize_delta(size_type delta) {
    bool did_resize = false;
    if (settings.consider_shrink()) {  // see if lots of deletes happened
      if (maybe_shrink()) did_resize = true;
    }
    if (num_elements >= (std::numeric_limits<size_type>::max)() - delta) {
      throw std::length_error("resize overflow");
    }
    if (bucket_count() >= HT_MIN_BUCKETS &&
        (num_elements + delta) <= settings.enlarge_threshold())
      return did_resize;  // we're ok as we are

    // Sometimes, we need to resize just to get rid of all the
    // "deleted" buckets that are clogging up the hashtable.  So when
    // deciding whether to resize, count the deleted buckets (which
    // are currently taking up room).  But later, when we decide what
    // size to resize to, *don't* count deleted buckets, since they
    // get discarded during the resize.
    size_type needed_size = settings.min_buckets(num_elements + delta, 0);
    if (needed_size <= bucket_count())  // we have enough buckets
      return did_resize;

    size_type resize_to = settings.min_buckets(
        num_elements - num_deleted + delta, bucket_count());

    // When num_deleted is large, we may still grow but we do not want to
    // over expand.  So we reduce needed_size by a portion of num_deleted
    // (the exact portion does not matter).  This is especially helpful
    // when min_load_factor is zero (no shrink at all) to avoid doubling
    // the bucket count to infinity.  See also test ResizeWithoutShrink.
    needed_size = settings.min_buckets(num_elements - num_deleted / 4 + delta, 0);

    if (resize_to < needed_size &&  // may double resize_to
        resize_to < (std::numeric_limits<size_type>::max)() / 2) {
      // This situation means that we have enough deleted elements,
      // that once we purge them, we won't actually have needed to
      // grow.  But we may want to grow anyway: if we just purge one
      // element, say, we'll have to grow anyway next time we
      // insert.  Might as well grow now, since we're already going
      // through the trouble of copying (in order to purge the
      // deleted elements).
      const size_type target =
          static_cast<size_type>(settings.shrink_size(resize_to * 2));
      if (num_elements - num_deleted + delta >= target) {
        // Good, we won't be below the shrink threshhold even if we double.
        resize_to *= 2;
      }
    }
    dense_hashtable tmp(std::move(*this), resize_to);
    swap(tmp);  // now we are tmp
    return true;
  }